

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

int oonf_layer2_net_remove_ip(oonf_layer2_peer_address *ip,oonf_layer2_origin *origin)

{
  oonf_layer2_origin *origin_local;
  oonf_layer2_peer_address *ip_local;
  
  if (ip->origin == origin) {
    oonf_class_event(&_l2net_addr_class,ip,OONF_OBJECT_REMOVED);
    avl_remove(&ip->l2net->local_peer_ips,&ip->_net_node);
    avl_remove(&_local_peer_ips_tree,&ip->_global_node);
    oonf_class_free(&_l2net_addr_class,ip);
    ip_local._4_4_ = 0;
  }
  else {
    ip_local._4_4_ = -1;
  }
  return ip_local._4_4_;
}

Assistant:

int
oonf_layer2_net_remove_ip(struct oonf_layer2_peer_address *ip, const struct oonf_layer2_origin *origin) {
  if (ip->origin != origin) {
    return -1;
  }

  oonf_class_event(&_l2net_addr_class, ip, OONF_OBJECT_REMOVED);

  avl_remove(&ip->l2net->local_peer_ips, &ip->_net_node);
  avl_remove(&_local_peer_ips_tree, &ip->_global_node);
  oonf_class_free(&_l2net_addr_class, ip);
  return 0;
}